

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<unsigned_long,libdivide::divider<unsigned_long,(libdivide::Branching)1>>
                   (random_numerators<unsigned_long> *vals,
                   divider<unsigned_long,_(libdivide::Branching)1> *div)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  random_numerators<unsigned_long> *prVar3;
  long lVar4;
  ulong *in_RSI;
  random_numerators<unsigned_long> *in_RDI;
  const_iterator iter;
  UIntT sum;
  uint64_t t;
  uint64_t q;
  __uint128_t rl;
  __uint128_t yl;
  __uint128_t xl;
  random_numerators<unsigned_long> *prVar5;
  random_numerators<unsigned_long> *local_b8;
  uint64_t local_b0;
  
  local_b0 = 0;
  local_b8 = (random_numerators<unsigned_long> *)random_numerators<unsigned_long>::begin(in_RDI);
  while( true ) {
    prVar5 = local_b8;
    prVar3 = (random_numerators<unsigned_long> *)random_numerators<unsigned_long>::end(local_b8);
    if (prVar5 == prVar3) break;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_b8->_pData;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *in_RSI;
    lVar4 = SUB168(auVar1 * auVar2,8);
    local_b0 = (((ulong)((long)local_b8->_pData - lVar4) >> 1) + lVar4 >> ((byte)in_RSI[1] & 0x3f))
               + local_b0;
    local_b8 = (random_numerators<unsigned_long> *)&local_b8->_length;
  }
  return local_b0;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}